

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O2

bool __thiscall
ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_Mesh *mesh)

{
  ON_2fPointArray *this_00;
  ushort uVar1;
  ON_SubDFace *pOVar2;
  uint *puVar3;
  ON_2dVector ngon_sub_pack_rect_delta_00;
  ON_2dVector ngon_sub_pack_rect_size_00;
  double dVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ON_SimpleArray<ON_3dPoint> *this_01;
  ON_SubDFace *this_02;
  ON_SubDVertex *pOVar9;
  int iVar10;
  ON_3dPoint *pOVar11;
  ON_SubDFace **ppOVar12;
  uint i;
  ON_2dPoint *pOVar13;
  size_t newcap;
  size_t sVar14;
  ON_SubDFace *pOVar15;
  ON_SubDFace **ppOVar16;
  uint i_1;
  ulong uVar17;
  long lVar18;
  ON_3fVectorArray *this_03;
  ulong uVar19;
  undefined1 auVar20 [16];
  ON_2dVector OVar21;
  ON_2dVector face_pack_rect_size;
  long local_300;
  ON_3dPoint C;
  ON_MeshFace local_2c8;
  ON_SimpleArray<ON_2dPoint> *local_2b8;
  ON_MeshNgon *local_2b0;
  ON_SimpleArray<ON_3fVector> *local_2a8;
  ON_SimpleArray<ON_MeshFace> *local_2a0;
  ON_SubDFace *local_298;
  ON_3fVector N;
  ON_SimpleArray<ON_3dPoint> P;
  ON_3dPoint faceT [2];
  ON_2udex local_228;
  ON_2dVector ngon_sub_pack_rect_delta;
  ON_2dVector ngon_sub_pack_rect_size;
  ON_3dPoint local_1f0;
  ON_2dVector local_1d8;
  ON_2dVector local_1c8;
  ON_MappingTag mapping_tag;
  ON_3dPoint quadP [4];
  ON_2dPoint quadS [4];
  ON_2dPoint face_pack_rect_corners [4];
  
  uVar6 = TexturePointsAreSet(this);
  uVar7 = FaceCount(this);
  ppOVar16 = level->m_face;
  newcap = 0;
  sVar14 = 0;
  bVar5 = false;
  ppOVar12 = ppOVar16;
  while( true ) {
    pOVar2 = *ppOVar12;
    iVar10 = (int)newcap;
    if (pOVar2 == (ON_SubDFace *)0x0) break;
    uVar8 = ON_SubDFace::EdgeCount(pOVar2);
    if (2 < uVar8) {
      if (!bVar5) {
        if (uVar8 == 4) {
          newcap = (size_t)(iVar10 + 1);
          goto LAB_006266d0;
        }
        iVar10 = iVar10 * 4;
        bVar5 = true;
        sVar14 = newcap;
      }
      sVar14 = (size_t)((uint)(uVar8 == 4) + (int)sVar14);
      newcap = (size_t)(iVar10 + uVar8);
    }
LAB_006266d0:
    ppOVar12 = &pOVar2->m_next_face;
  }
  if (iVar10 == 0) {
    ON_SubDIncrementErrorCount();
    goto LAB_0062753a;
  }
  local_2a0 = &mesh->m_F;
  ON_SimpleArray<ON_MeshFace>::Reserve(local_2a0,newcap);
  if (-1 < (mesh->m_F).m_capacity) {
    (mesh->m_F).m_count = 0;
  }
  local_2a8 = &(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>;
  ON_SimpleArray<ON_3fVector>::Reserve(local_2a8,newcap);
  if (-1 < (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  uVar17 = (ulong)(uint)(iVar10 * 4 + (int)sVar14 * -7);
  this_01 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
  ON_SimpleArray<ON_3dPoint>::Reserve(this_01,uVar17);
  if (-1 < this_01->m_capacity) {
    this_01->m_count = 0;
  }
  this_03 = &mesh->m_N;
  ON_SimpleArray<ON_3fVector>::Reserve(&this_03->super_ON_SimpleArray<ON_3fVector>,uVar17);
  if (-1 < (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  uVar6 = uVar6 * 2;
  local_2b8 = &(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
  ON_SimpleArray<ON_2dPoint>::Reserve(local_2b8,uVar17);
  if (-1 < (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
    (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  }
  if (uVar7 < uVar6) {
    ON_SimpleArray<ON_2fPoint>::Reserve(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar17);
  }
  if (-1 < (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity) {
    (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
  }
  ON_SimpleArray<ON_MeshFace>::Reserve(local_2a0,newcap);
  if (-1 < (mesh->m_F).m_capacity) {
    (mesh->m_F).m_count = 0;
  }
  ON_SimpleArray<ON_3fVector>::Reserve(local_2a8,newcap);
  if (-1 < (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity) {
    (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  }
  dVar4 = ON_DBL_QNAN;
  this_00 = &mesh->m_T;
  if (bVar5) {
    ngon_sub_pack_rect_size.x = ON_2dVector::NanVector.x;
    ngon_sub_pack_rect_size.y = ON_2dVector::NanVector.y;
    ngon_sub_pack_rect_delta.x = ON_2dVector::NanVector.x;
    ngon_sub_pack_rect_delta.y = ON_2dVector::NanVector.y;
    quadS[0].x = ON_2dPoint::NanPoint.x;
    quadS[0].y = ON_2dPoint::NanPoint.y;
    quadS[1].x = ON_2dPoint::NanPoint.x;
    quadS[1].y = ON_2dPoint::NanPoint.y;
    quadS[2].x = ON_2dPoint::NanPoint.x;
    quadS[2].y = ON_2dPoint::NanPoint.y;
    quadS[3].x = ON_2dPoint::NanPoint.x;
    quadS[3].y = ON_2dPoint::NanPoint.y;
    mapping_tag._16_8_ = ON_3dPoint::NanPoint.z;
    mapping_tag.m_mapping_id.Data4 = (uchar  [8])ON_3dPoint::NanPoint.y;
    mapping_tag.m_mapping_id._0_8_ = ON_3dPoint::NanPoint.x;
    mapping_tag.m_mesh_xform.m_xform[0][0] = ON_3dPoint::NanPoint.x;
    mapping_tag.m_mesh_xform.m_xform[0][1] = ON_3dPoint::NanPoint.y;
    mapping_tag.m_mesh_xform.m_xform[0][2] = ON_3dPoint::NanPoint.z;
    mapping_tag.m_mesh_xform.m_xform[0][3] = ON_3dPoint::NanPoint.x;
    mapping_tag.m_mesh_xform.m_xform[1][0] = ON_3dPoint::NanPoint.y;
    mapping_tag.m_mesh_xform.m_xform[1][1] = ON_3dPoint::NanPoint.z;
    mapping_tag.m_mesh_xform.m_xform[1][2] = ON_3dPoint::NanPoint.x;
    mapping_tag.m_mesh_xform.m_xform[1][3] = ON_3dPoint::NanPoint.y;
    mapping_tag.m_mesh_xform.m_xform[2][0] = ON_3dPoint::NanPoint.z;
    faceT[0].z = ON_3dPoint::NanPoint.z;
    faceT[0].x = ON_3dPoint::NanPoint.x;
    faceT[0].y = ON_3dPoint::NanPoint.y;
    faceT[1].x = ON_3dPoint::NanPoint.x;
    faceT[1].y = ON_3dPoint::NanPoint.y;
    faceT[1].z = ON_3dPoint::NanPoint.z;
    ON_SimpleArray<ON_3dPoint>::ON_SimpleArray(&P,0x40);
    while (pOVar2 = *ppOVar16, pOVar2 != (ON_SubDFace *)0x0) {
      uVar1 = pOVar2->m_edge_count;
      this_02 = (ON_SubDFace *)(ulong)uVar1;
      if (2 < uVar1) {
        if (-1 < P.m_capacity) {
          P.m_count = 0;
        }
        uVar8 = 0;
        while ((local_300._0_4_ = (uint)uVar1, (uint)local_300 != uVar8 &&
               (pOVar9 = ON_SubDFace::Vertex(pOVar2,uVar8), pOVar9 != (ON_SubDVertex *)0x0))) {
          ON_SubDVertex::ControlNetPoint(&C,pOVar9);
          bVar5 = ON_3dPoint::IsValid(&C);
          if (!bVar5) break;
          ON_SubDVertex::ControlNetPoint(&local_1f0,pOVar9);
          ON_SimpleArray<ON_3dPoint>::Append(&P,&local_1f0);
          uVar8 = uVar8 + 1;
        }
        if (P.m_count == (uint)local_300) {
          ON_SubDFace::ControlNetCenterPoint(&C,pOVar2);
          quadP[0].z = C.z;
          quadP[0].x = C.x;
          quadP[0].y = C.y;
          bVar5 = ON_3dPoint::IsValid(quadP);
          if (bVar5) {
            ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&C,pOVar2);
            ON_3fVector::ON_3fVector(&N,(ON_3dVector *)&C);
            ON_SubDFace::GetFacePackRectCorners(pOVar2,false,face_pack_rect_corners);
            OVar21 = ON_SubDFace::PackRectSize(pOVar2);
            local_2b0 = (ON_MeshNgon *)OVar21.x;
            if (uVar7 < uVar6) {
              ON_SubDFace::TexturePoint(&C,pOVar2,(uint)local_300 - 1);
              faceT[0].z = C.z;
              faceT[0].x = C.x;
              faceT[0].y = C.y;
              ON_SubDFace::TexturePoint(&C,pOVar2,0);
              faceT[1].z = C.z;
              faceT[1].x = C.x;
              faceT[1].y = C.y;
              ON_SubDFace::TextureCenterPoint(&C,pOVar2);
              mapping_tag._16_8_ = C.z;
              mapping_tag.m_mapping_id = (ON_UUID)C._0_16_;
            }
            if ((uint)local_300 == 4) {
              local_2c8.vi[0] = this_01->m_count;
              ON_SimpleArray<ON_3dPoint>::Append(this_01,quadP);
              ON_SimpleArray<ON_3fVector>::Append(&this_03->super_ON_SimpleArray<ON_3fVector>,&N);
              local_1f0._0_16_ = ON_SubDFace::PackRectOrigin(pOVar2);
              local_1d8 = ON_SubDFace::PackRectSize(pOVar2);
              local_1c8 = ::operator*(0.5,&local_1d8);
              C._0_16_ = ON_2dPoint::operator+((ON_2dPoint *)&local_1f0,&local_1c8);
              ON_SimpleArray<ON_2dPoint>::Append(local_2b8,(ON_2dPoint *)&C);
              if (uVar7 < uVar6) {
                ON_2fPoint::ON_2fPoint((ON_2fPoint *)&C,(ON_3dPoint *)&mapping_tag);
                ON_SimpleArray<ON_2fPoint>::Append
                          (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&C);
              }
              local_2b0 = ON_Mesh::AllocateNgon(mesh,8,4);
              uVar8 = this_01->m_count;
              puVar3 = local_2b0->m_vi;
              *puVar3 = uVar8;
              auVar20._0_4_ = uVar8 + 1;
              auVar20._4_4_ = uVar8 + 2;
              auVar20._8_4_ = uVar8 + 3;
              auVar20._12_4_ = uVar8 + 4;
              *(undefined1 (*) [16])(puVar3 + 1) = auVar20;
              *(ulong *)(puVar3 + 5) = CONCAT44(uVar8 + 6,uVar8 + 5);
              puVar3[7] = uVar8 + 7;
              uVar8 = (mesh->m_F).m_count;
              puVar3 = local_2b0->m_fi;
              *puVar3 = uVar8;
              *(ulong *)(puVar3 + 1) = CONCAT44(uVar8 + 2,uVar8 + 1);
              puVar3[3] = uVar8 + 3;
              pOVar13 = face_pack_rect_corners;
              local_300 = 0;
              for (local_298 = (ON_SubDFace *)0x1; local_298 != (ON_SubDFace *)0x5;
                  local_298 = (ON_SubDFace *)((long)local_298 + 1)) {
                ON_SimpleArray<ON_3dPoint>::Append
                          (this_01,(ON_3dPoint *)((long)&(P.m_a)->x + local_300));
                uVar8 = (uint)local_298 & 3;
                ON_3dPoint::Midpoint(&C,(ON_3dPoint *)((long)&(P.m_a)->x + local_300),P.m_a + uVar8)
                ;
                ON_SimpleArray<ON_3dPoint>::Append(this_01,&C);
                ON_SimpleArray<ON_3fVector>::Append(&this_03->super_ON_SimpleArray<ON_3fVector>,&N);
                ON_SimpleArray<ON_3fVector>::Append(&this_03->super_ON_SimpleArray<ON_3fVector>,&N);
                ON_SimpleArray<ON_2dPoint>::Append(local_2b8,pOVar13);
                C._0_16_ = ON_2dPoint::Midpoint
                                     (pOVar13,(ON_2dPoint *)
                                              ((long)&face_pack_rect_corners[0].x +
                                              (ulong)(uVar8 << 4)));
                ON_SimpleArray<ON_2dPoint>::Append(local_2b8,(ON_2dPoint *)&C);
                if (uVar7 < uVar6) {
                  faceT[0].z = faceT[1].z;
                  faceT[0].x = faceT[1].x;
                  faceT[0].y = faceT[1].y;
                  ON_SubDFace::TexturePoint(&C,pOVar2,uVar8);
                  faceT[1].z = C.z;
                  faceT[1].x = C.x;
                  faceT[1].y = C.y;
                  ON_2fPoint::ON_2fPoint((ON_2fPoint *)&C,faceT);
                  ON_SimpleArray<ON_2fPoint>::Append
                            (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&C);
                  ON_3dPoint::Midpoint(&C,faceT,faceT + 1);
                  ON_2fPoint::ON_2fPoint((ON_2fPoint *)&local_1f0,&C);
                  ON_SimpleArray<ON_2fPoint>::Append
                            (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&local_1f0);
                }
                local_300 = local_300 + 0x18;
                pOVar13 = pOVar13 + 1;
              }
              local_2c8.vi[3] = local_2b0->m_vi[7];
              local_298 = (ON_SubDFace *)0x5;
              for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                local_2c8.vi[2] = local_2b0->m_vi[lVar18 * 2];
                local_2c8.vi[1] = local_2c8.vi[3];
                local_2c8.vi[3] = local_2b0->m_vi[lVar18 * 2] + 1;
                ON_SimpleArray<ON_MeshFace>::Append(local_2a0,&local_2c8);
                ON_SimpleArray<ON_3fVector>::Append(local_2a8,&N);
              }
              ON_Mesh::AddNgon(mesh,local_2b0);
            }
            else {
              ON_3dPoint::Midpoint(&C,P.m_a + ((uint)local_300 - 1),P.m_a);
              pOVar11 = quadP + 3;
              quadP[3].z = C.z;
              quadP[3].x = C.x;
              quadP[3].y = C.y;
              if (uVar7 < uVar6) {
                ON_3dPoint::Midpoint(&C,faceT,faceT + 1);
                pOVar11 = (ON_3dPoint *)&mapping_tag.m_mesh_xform;
                mapping_tag.m_mesh_xform.m_xform[2][0] = C.z;
                mapping_tag.m_mesh_xform.m_xform[1][2] = C.x;
                mapping_tag.m_mesh_xform.m_xform[1][3] = C.y;
              }
              if (uVar1 < 5) {
                local_228 = ON_2udex::Zero;
              }
              else {
                OVar21.x = (double)local_2b0;
                local_228 = ON_SubDFace::GetNgonSubPackRectSizeAndDelta
                                      (this_02,(uint)&ngon_sub_pack_rect_size,OVar21,
                                       &ngon_sub_pack_rect_delta,(ON_2dVector *)pOVar11);
              }
              pOVar15 = (ON_SubDFace *)0x0;
              local_298 = this_02;
              while (pOVar15 != local_298) {
                if ((uint)local_300 == 3) {
                  ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners
                            (false,face_pack_rect_corners,(uint)pOVar15,false,quadS);
                }
                else {
                  ngon_sub_pack_rect_size_00.y = ngon_sub_pack_rect_size.y;
                  ngon_sub_pack_rect_size_00.x = ngon_sub_pack_rect_size.x;
                  ngon_sub_pack_rect_delta_00.y = ngon_sub_pack_rect_delta.y;
                  ngon_sub_pack_rect_delta_00.x = ngon_sub_pack_rect_delta.x;
                  face_pack_rect_size.y = OVar21.y;
                  face_pack_rect_size.x = (double)local_2b0;
                  ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners
                            ((uint)local_300,(uint)pOVar15,false,face_pack_rect_corners,
                             face_pack_rect_size,local_228,ngon_sub_pack_rect_size_00,
                             ngon_sub_pack_rect_delta_00,quadS);
                }
                quadP[1].z = quadP[3].z;
                quadP[1].x = quadP[3].x;
                quadP[1].y = quadP[3].y;
                pOVar11 = P.m_a + (long)pOVar15;
                quadP[2].z = P.m_a[(long)pOVar15].z;
                quadP[2].x = P.m_a[(long)pOVar15].x;
                quadP[2].y = P.m_a[(long)pOVar15].y;
                pOVar15 = (ON_SubDFace *)
                          ((long)&(pOVar15->super_ON_SubDComponentBase).m_subd_point1 + 1);
                uVar17 = ((ulong)pOVar15 & 0xffffffff) % (ulong)this_02;
                ON_3dPoint::Midpoint(&C,pOVar11,P.m_a + uVar17);
                quadP[3].z = C.z;
                quadP[3].x = C.x;
                quadP[3].y = C.y;
                if (uVar7 < uVar6) {
                  faceT[0].z = faceT[1].z;
                  faceT[0].x = faceT[1].x;
                  faceT[0].y = faceT[1].y;
                  ON_SubDFace::TexturePoint(&C,pOVar2,(uint)uVar17);
                  faceT[1].z = C.z;
                  faceT[1].x = C.x;
                  faceT[1].y = C.y;
                  mapping_tag.m_mesh_xform.m_xform[0][2] = mapping_tag.m_mesh_xform.m_xform[2][0];
                  mapping_tag.m_mesh_xform.m_xform[0][0] = mapping_tag.m_mesh_xform.m_xform[1][2];
                  mapping_tag.m_mesh_xform.m_xform[0][1] = mapping_tag.m_mesh_xform.m_xform[1][3];
                  mapping_tag.m_mesh_xform.m_xform[1][1] = faceT[0].z;
                  mapping_tag.m_mesh_xform.m_xform[0][3] = faceT[0].x;
                  mapping_tag.m_mesh_xform.m_xform[1][0] = faceT[0].y;
                  ON_3dPoint::Midpoint(&C,faceT,faceT + 1);
                  mapping_tag.m_mesh_xform.m_xform[2][0] = C.z;
                  mapping_tag.m_mesh_xform.m_xform[1][2] = C.x;
                  mapping_tag.m_mesh_xform.m_xform[1][3] = C.y;
                }
                local_2c8.vi[0] = this_01->m_count;
                local_2c8.vi[1] = local_2c8.vi[0] + 1;
                local_2c8.vi[2] = local_2c8.vi[0] + 2;
                local_2c8.vi[3] = local_2c8.vi[0] + 3;
                pOVar13 = quadS;
                for (lVar18 = 0; lVar18 != 0x60; lVar18 = lVar18 + 0x18) {
                  ON_SimpleArray<ON_3dPoint>::Append
                            (this_01,(ON_3dPoint *)((long)&quadP[0].x + lVar18));
                  ON_SimpleArray<ON_3fVector>::Append
                            (&this_03->super_ON_SimpleArray<ON_3fVector>,&N);
                  ON_SimpleArray<ON_2dPoint>::Append(local_2b8,pOVar13);
                  if (uVar7 < uVar6) {
                    ON_2fPoint::ON_2fPoint
                              ((ON_2fPoint *)&C,
                               (ON_3dPoint *)(mapping_tag.m_mapping_id.Data4 + lVar18 + -8));
                    ON_SimpleArray<ON_2fPoint>::Append
                              (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)&C);
                  }
                  pOVar13 = pOVar13 + 1;
                }
                ON_SimpleArray<ON_MeshFace>::Append(local_2a0,&local_2c8);
                ON_SimpleArray<ON_3fVector>::Append(local_2a8,&N);
              }
            }
          }
        }
      }
      ppOVar16 = &pOVar2->m_next_face;
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&P);
  }
  else {
    while (pOVar2 = *ppOVar16, pOVar2 != (ON_SubDFace *)0x0) {
      if (pOVar2->m_edge_count == 4) {
        quadP[3].x = dVar4;
        pOVar11 = quadP;
        lVar18 = 0;
        do {
          if ((lVar18 == 4) ||
             (pOVar9 = ON_SubDFace::Vertex(pOVar2,(uint)lVar18), pOVar9 == (ON_SubDVertex *)0x0))
          break;
          ON_SubDVertex::ControlNetPoint((ON_3dPoint *)&mapping_tag,pOVar9);
          pOVar11->z = (double)mapping_tag._16_8_;
          pOVar11->x = (double)mapping_tag.m_mapping_id._0_8_;
          pOVar11->y = (double)mapping_tag.m_mapping_id.Data4;
          bVar5 = ON_3dPoint::IsValid(pOVar11);
          lVar18 = lVar18 + 1;
          pOVar11 = pOVar11 + 1;
        } while (bVar5);
        bVar5 = ON_3dPoint::IsValid(quadP + 3);
        if (bVar5) {
          ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&mapping_tag,pOVar2);
          ON_3fVector::ON_3fVector((ON_3fVector *)quadS,(ON_3dVector *)&mapping_tag);
          local_2c8.vi[0] = this_01->m_count;
          local_2c8.vi[1] = local_2c8.vi[0] + 1;
          local_2c8.vi[2] = local_2c8.vi[0] + 2;
          local_2c8.vi[3] = local_2c8.vi[0] + 3;
          ON_SimpleArray<ON_MeshFace>::Append(local_2a0,&local_2c8);
          ON_SimpleArray<ON_3fVector>::Append(local_2a8,(ON_3fVector *)quadS);
          pOVar11 = quadP;
          for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
            ON_SimpleArray<ON_3dPoint>::Append(this_01,pOVar11);
            ON_SimpleArray<ON_3fVector>::Append
                      (&this_03->super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)quadS);
            mapping_tag.m_mapping_id =
                 (ON_UUID)ON_SubDFace::PackRectCorner(pOVar2,false,(uint)lVar18);
            ON_SimpleArray<ON_2dPoint>::Append(local_2b8,(ON_2dPoint *)&mapping_tag);
            if (uVar7 < uVar6) {
              ON_SubDFace::TexturePoint((ON_3dPoint *)&mapping_tag,pOVar2,(uint)lVar18);
              ON_2fPoint::ON_2fPoint((ON_2fPoint *)faceT,(ON_3dPoint *)&mapping_tag);
              ON_SimpleArray<ON_2fPoint>::Append
                        (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)faceT);
            }
            pOVar11 = pOVar11 + 1;
          }
        }
      }
      ppOVar16 = &pOVar2->m_next_face;
    }
  }
  TextureMappingTag(&mapping_tag,this,false);
  dVar4 = ON_Interval::ZeroToOne.m_t[1];
  if ((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == this_01->m_count) {
    *(double *)&mesh->field_0x240 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x248 = dVar4;
    dVar4 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x250 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x258 = dVar4;
    mesh->m_srf_scale[0] = 0.0;
    mesh->m_srf_scale[1] = 0.0;
    dVar4 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x270 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x278 = dVar4;
    dVar4 = ON_Interval::ZeroToOne.m_t[1];
    *(double *)&mesh->field_0x280 = ON_Interval::ZeroToOne.m_t[0];
    *(double *)&mesh->field_0x288 = dVar4;
    mesh->m_packed_tex_rotate = false;
    if (uVar7 < uVar6) goto LAB_00627503;
    bVar5 = ON_MappingTag::IsSet(&mapping_tag);
    if ((!bVar5) || (bVar5 = ON_MappingTag::IsDefaultSurfaceParameterMapping(&mapping_tag), bVar5))
    {
      uVar8 = (mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
      ON_SimpleArray<ON_2fPoint>::Reserve
                (&this_00->super_ON_SimpleArray<ON_2fPoint>,(long)(int)uVar8);
      if (-1 < (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity) {
        (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
      }
      uVar19 = 0;
      uVar17 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar17 = uVar19;
      }
      for (; uVar17 * 0x10 != uVar19; uVar19 = uVar19 + 0x10) {
        ON_2fPoint::ON_2fPoint
                  ((ON_2fPoint *)quadS,
                   (ON_2dPoint *)
                   ((long)&((mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x + uVar19));
        ON_SimpleArray<ON_2fPoint>::Append
                  (&this_00->super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)quadS);
      }
      goto LAB_006274f4;
    }
  }
  else {
    ON_SimpleArray<ON_2dPoint>::Destroy(local_2b8);
    if (mapping_tag.m_mapping_type == srfp_mapping) {
      memcpy(&mapping_tag,&ON_MappingTag::Unset,0x98);
    }
LAB_006274f4:
    if (uVar7 < uVar6) {
LAB_00627503:
      if ((mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != this_01->m_count) {
        ON_SimpleArray<ON_2fPoint>::Destroy(&this_00->super_ON_SimpleArray<ON_2fPoint>);
      }
    }
  }
  memcpy(&mesh->m_Ttag,&mapping_tag,0x98);
LAB_0062753a:
  return iVar10 != 0;
}

Assistant:

bool ON_SubD::Internal_GetTextureCoordinatesGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_Mesh& mesh
) const
{
  const bool bSetMeshT = 2 * this->TexturePointsAreSet() > this->FaceCount(); // more than half the faces have texture points.

  bool bSubdivide = false; // required if any SubD faces are not quads.
  unsigned mesh_4gon_count = 0;
  unsigned mesh_quad_count = 0;
  for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
  {
    const unsigned n = f->EdgeCount();
    if (n < 3)
      continue;

    if (false == bSubdivide)
    {
      if (4 == n)
      {
        // subdivision is not required and we have another quad face
        ++mesh_quad_count;
        continue;
      }
      // first non-quad SubD face - switch to subdivided case
      bSubdivide = true;

      // each of the previously counted quad faces will generate 9 mesh vertices, 4 mesh faces, and a single ON_MeshNgon.
      mesh_4gon_count = mesh_quad_count;
      mesh_quad_count *= 4;
    }

    // In the subdivided case, each SubD face is represented by n quads in the ON_Mesh.
    if ( 4 == n)
      ++mesh_4gon_count;
    mesh_quad_count += n;
  }

  if (mesh_quad_count < 1)
    return ON_SUBD_RETURN_ERROR(false);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  const unsigned mesh_vertex_count = 4 * (mesh_quad_count - 4* mesh_4gon_count) + 9 * mesh_4gon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(mesh_vertex_count);
  D.SetCount(0);
  mesh.m_N.Reserve(mesh_vertex_count);
  mesh.m_N.SetCount(0);
  mesh.m_S.Reserve(mesh_vertex_count);
  mesh.m_S.SetCount(0);
  if (bSetMeshT)
    mesh.m_T.Reserve(mesh_vertex_count);
  mesh.m_T.SetCount(0);

  mesh.m_F.Reserve(mesh_quad_count);
  mesh.m_F.SetCount(0);
  mesh.m_FN.Reserve(mesh_quad_count);
  mesh.m_FN.SetCount(0);

  ON_MeshFace mesh_f;
  ON_2dPoint face_pack_rect_corners[4];
  ON_3dPoint quadP[4];
  if (bSubdivide)
  {
    ON_2dVector ngon_sub_pack_rect_size = ON_2dVector::NanVector;
    ON_2dVector ngon_sub_pack_rect_delta = ON_2dVector::NanVector;
    ON_2dPoint quadS[4] = { ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint, ON_2dPoint::NanPoint };
    ON_3dPoint quadT[4] = { ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint, ON_3dPoint::NanPoint };
    ON_3dPoint faceT[2] = { ON_3dPoint ::NanPoint, ON_3dPoint::NanPoint };


    ON_SimpleArray<ON_3dPoint> P(64);
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      const unsigned n = f->m_edge_count;
      if (n < 3)
        continue;

      P.SetCount(0);
      for (unsigned i = 0; i < n; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        const ON_3dPoint C = v->ControlNetPoint();
        if (false == C.IsValid())
          break;
        P.Append(v->ControlNetPoint());
      }
      if (n != P.UnsignedCount())
        continue;

      quadP[0] = f->ControlNetCenterPoint();
      if (false == quadP[0].IsValid())
        continue;

      const ON_3fVector N(f->ControlNetCenterNormal());

      f->GetFacePackRectCorners(false, face_pack_rect_corners);
      const ON_2dVector face_pack_rect_size = f->PackRectSize();

      if (bSetMeshT)
      {
        faceT[0] = f->TexturePoint(n - 1);
        faceT[1] = f->TexturePoint(0);
        quadT[0] = f->TextureCenterPoint();
      }


      if (4 == n)
      {
        // An ON_SubDFace quad becomes an ON_Mesh ngon made from 4 ON_Mesh quads.

        // center point
        mesh_f.vi[0] = D.UnsignedCount();
        D.Append(quadP[0]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectOrigin() + 0.5 * f->PackRectSize());
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(quadT[0]));

        ON_MeshNgon* four_gon = mesh.AllocateNgon(8,4);
        four_gon->m_vi[0] = D.UnsignedCount();
        four_gon->m_vi[1] = four_gon->m_vi[0] + 1;
        four_gon->m_vi[2] = four_gon->m_vi[0] + 2;
        four_gon->m_vi[3] = four_gon->m_vi[0] + 3;
        four_gon->m_vi[4] = four_gon->m_vi[0] + 4;
        four_gon->m_vi[5] = four_gon->m_vi[0] + 5;
        four_gon->m_vi[6] = four_gon->m_vi[0] + 6;
        four_gon->m_vi[7] = four_gon->m_vi[0] + 7;

        four_gon->m_fi[0] = mesh.m_F.UnsignedCount();
        four_gon->m_fi[1] = four_gon->m_fi[0] + 1;
        four_gon->m_fi[2] = four_gon->m_fi[0] + 2;
        four_gon->m_fi[3] = four_gon->m_fi[0] + 3;

        // add 8 boundary vertices
        for (unsigned i = 0; i < 4; ++i)
        {
          D.Append(P[i]);
          D.Append(ON_3dPoint::Midpoint(P[i], P[(i + 1) % 4]));
          mesh.m_N.Append(N);
          mesh.m_N.Append(N);
          mesh.m_S.Append(face_pack_rect_corners[i]);
          mesh.m_S.Append(ON_2dPoint::Midpoint(face_pack_rect_corners[i], face_pack_rect_corners[(i+1)%4]));
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % 4);
            mesh.m_T.Append(ON_2fPoint(faceT[0]));
            mesh.m_T.Append(ON_2fPoint(ON_3dPoint::Midpoint(faceT[0], faceT[1])));
          }
        }

        // add 4 ON_Mesh quads that make up the ON_SubDFace quad
        mesh_f.vi[3] = four_gon->m_vi[7];
        for (unsigned i = 0; i < 4; ++i)
        {
          mesh_f.vi[1] = mesh_f.vi[3];
          mesh_f.vi[2] = four_gon->m_vi[2 * i];
          mesh_f.vi[3] = mesh_f.vi[2] + 1;
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }

        // add an ON_MeshNgon that represents the ON_SubDFace quad
        mesh.AddNgon(four_gon);
      }
      else
      {
        quadP[3] = ON_3dPoint::Midpoint(P[n - 1], P[0]);
        if (bSetMeshT)
          quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);


        const ON_2udex ngon_grid_size
          = (n >= 5)
          ? ON_SubDFace::GetNgonSubPackRectSizeAndDelta(n, face_pack_rect_size, ngon_sub_pack_rect_size, ngon_sub_pack_rect_delta)
          : ON_2udex::Zero;

        // an ON_Mesh n-gon is not possible because the fake packed surface parameters are not continuous across the ON_SubD face.
        for (unsigned i = 0; i < n; ++i)
        {
          if (3 == n)
          {
            ON_SubDMeshFragment::Get3gonFaceFragmentPackRectCorners(false, face_pack_rect_corners, i, false, quadS);
          }
          else
          {
            ON_SubDMeshFragment::GetNgonFaceFragmentPackRectCorners(
              n,
              i,
              false,
              face_pack_rect_corners,
              face_pack_rect_size,
              ngon_grid_size,
              ngon_sub_pack_rect_size,
              ngon_sub_pack_rect_delta,
              quadS
            );
          }

          quadP[1] = quadP[3];
          quadP[2] = P[i];
          quadP[3] = ON_3dPoint::Midpoint(P[i], P[(i + 1) % n]);
          if (bSetMeshT)
          {
            faceT[0] = faceT[1];
            faceT[1] = f->TexturePoint((i + 1) % n);
            quadT[1] = quadT[3];
            quadT[2] = faceT[0];
            quadT[3] = ON_3dPoint::Midpoint(faceT[0], faceT[1]);
          }

          mesh_f.vi[0] = D.UnsignedCount();
          mesh_f.vi[1] = mesh_f.vi[0] + 1;
          mesh_f.vi[2] = mesh_f.vi[1] + 1;
          mesh_f.vi[3] = mesh_f.vi[2] + 1;

          for (unsigned j = 0; j < 4U; ++j)
          {
            D.Append(quadP[j]);
            mesh.m_N.Append(N);
            mesh.m_S.Append(quadS[j]);
            if (bSetMeshT)
              mesh.m_T.Append(ON_2fPoint(quadT[j]));
          }
          mesh.m_F.Append(mesh_f);
          mesh.m_FN.Append(N);
        }
      }
    }
  }
  else
  {
    // All SubD faces are quads
    for (const ON_SubDFace* f = level.m_face[0]; nullptr != f; f = f->m_next_face)
    {
      if (4 != f->m_edge_count)
        continue;
      quadP[3].x = ON_DBL_QNAN;
      for (unsigned i = 0; i < 4; ++i)
      {
        const ON_SubDVertex* v = f->Vertex(i);
        if (nullptr == v)
          break;
        quadP[i] = v->ControlNetPoint();
        if (false == quadP[i].IsValid())
          break;
      }
      if (false == quadP[3].IsValid())
        continue;
      const ON_3fVector N(f->ControlNetCenterNormal());
      mesh_f.vi[0] = D.UnsignedCount();
      mesh_f.vi[1] = mesh_f.vi[0] + 1;
      mesh_f.vi[2] = mesh_f.vi[1] + 1;
      mesh_f.vi[3] = mesh_f.vi[2] + 1;
      mesh.m_F.Append(mesh_f);
      mesh.m_FN.Append(N);
      for (unsigned i = 0; i < 4U; ++i)
      {
        D.Append(quadP[i]);
        mesh.m_N.Append(N);
        mesh.m_S.Append(f->PackRectCorner(false, i));
        if (bSetMeshT)
          mesh.m_T.Append(ON_2fPoint(f->TexturePoint(i)));
      }
    }
  }


  ON_MappingTag mapping_tag = this->TextureMappingTag(false);

  if (mesh.m_S.UnsignedCount() != D.UnsignedCount())
  {
    mesh.m_S.Destroy();
    if (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type)
      mapping_tag = ON_MappingTag::Unset;
  }
  else
  {
    // set fake surface mapping information
    mesh.m_srf_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_srf_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_srf_scale[0] = 0.0;
    mesh.m_srf_scale[1] = 0.0;
    mesh.m_packed_tex_domain[0] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_domain[1] = ON_Interval::ZeroToOne;
    mesh.m_packed_tex_rotate = false;

    if (
      false == bSetMeshT
      && (false == mapping_tag.IsSet() || mapping_tag.IsDefaultSurfaceParameterMapping())
      )
    {
      const int count = mesh.m_S.Count();
      mesh.m_T.Reserve(count);
      mesh.m_T.SetCount(0);
      for (int i = 0; i < count; ++i)
        mesh.m_T.Append(ON_2fPoint(mesh.m_S[i]));
    }
  }

  if (bSetMeshT)
  {
    if (mesh.m_T.UnsignedCount() != D.UnsignedCount())
      mesh.m_T.Destroy();
  }
  mesh.m_Ttag = mapping_tag;

  return true;
}